

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O3

parser<pstore::exchange::import_ns::callbacks> *
anon_unknown.dwarf_431e0c::ExternalFixupMembersImport::parse
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,string *src,
          database *db,string_mapping *names)

{
  parser<pstore::exchange::import_ns::callbacks> *ppVar1;
  parser<pstore::exchange::import_ns::callbacks> *extraout_RAX;
  external_fixup_collection fixups;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> local_48;
  not_null<external_fixup_collection_*> local_30;
  
  local_30.ptr_ = &local_48;
  local_48.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pstore::gsl::
  not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
  ::ensure_invariant(&local_30);
  ppVar1 = parse(__return_storage_ptr__,src,db,names,local_30);
  if (local_48.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    ppVar1 = extraout_RAX;
  }
  return ppVar1;
}

Assistant:

static decltype (auto) parse (std::string const & src, pstore::database * const db,
                                      pstore::exchange::import_ns::string_mapping const & names) {
            external_fixup_collection fixups;
            return parse (src, db, names, &fixups);
        }